

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetpmu.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint *puVar1;
  uint64_t uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  code *pcVar6;
  char *__ptr;
  ulong uVar7;
  ulong uVar8;
  code *pcVar9;
  size_t sStack_850;
  int hostmem;
  uint64_t pte;
  uint64_t phys_pages [256];
  
  uVar7 = 0;
  iVar3 = nva_init();
  if (iVar3 == 0) {
    uVar8 = (ulong)(uint)argc;
    if (argc < 1) {
      uVar8 = uVar7;
    }
    do {
      if (uVar8 == uVar7) {
        puVar1 = (uint *)(*nva_cards)->bar0;
        uVar4 = *puVar1 >> 0x14 & 0x1ff;
        if (uVar4 - 0x100 < 0xffffffa3) {
          __ptr = "Card unsupported.\n";
          sStack_850 = 0x12;
        }
        else {
          pcVar6 = gf100_pte_from_pde;
          if (uVar4 < 0xc0) {
            pcVar6 = g80_pte_from_pde;
          }
          pcVar9 = gf100_physpages_from_pt;
          if (uVar4 < 0xc0) {
            pcVar9 = g80_physpages_from_pt;
          }
          if ((~puVar1[0x42844] & 0x7ff00) == 0) {
            if ((puVar1[0x4291f] & 0xf0000000) == 0x70000000) {
              iVar3 = (*pcVar6)((ulong)(puVar1[0x4291f] & 0xfffffff) << 0xc,&pte,&hostmem);
              if (iVar3 != 0) {
                return iVar3;
              }
              uVar4 = (*pcVar9)(pte,hostmem,phys_pages);
              uVar7 = (ulong)uVar4;
              if ((int)uVar4 < 1) {
                uVar7 = 0;
              }
              for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
                uVar2 = phys_pages[uVar8];
                *(uint *)((long)(*nva_cards)->bar0 + 0x1700) =
                     (uint)(uVar2 >> 0x10) & 0xffffff | 0x2000000;
                for (uVar4 = 0; uVar4 < 0x1000; uVar4 = uVar4 + 4) {
                  uVar5 = peek(uVar4 + ((uint)uVar2 & 0xffff | 0x700000));
                  printf("%c%c%c%c",(ulong)uVar5,(ulong)(uVar5 >> 8),(ulong)(uVar5 >> 0x10),
                         (ulong)(uVar5 >> 0x18));
                }
              }
              return 0;
            }
            __ptr = "Channel not set up\n";
            sStack_850 = 0x13;
          }
          else {
            __ptr = "Register 0x10a110 not in order\n";
            sStack_850 = 0x1f;
          }
        }
        fwrite(__ptr,sStack_850,1,_stderr);
        goto LAB_00102657;
      }
      iVar3 = strcmp("--help",argv[uVar7]);
      uVar7 = uVar7 + 1;
    } while (iVar3 != 0);
    help();
    iVar3 = 0;
  }
  else {
    puts("Init failed");
LAB_00102657:
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
	int i = 0, j = 0;
	uint32_t tmp_reg;
	uint32_t boot0;
	uint64_t chan_ptr, pte;
	int hostmem;
	int ret;

	int (*pte_from_pde)(uint64_t, uint64_t *, int *);
	int (*physpages_from_pt)(uint64_t, int , uint64_t *);

	uint32_t hi = 0,lo = 0;
	uint64_t phys_pages[256];
	int entries = 0;

	if (nva_init()) {
		printf("Init failed\n");
		return -1;
	}

	for (i = 0; i < argc; i++) {
		if(strcmp("--help",argv[i]) == 0) {
			help();
			return 0;
		}
	}

	// Check card generation
	boot0 = (peek(0x0) & 0x1ff00000) >> 20;
	if (boot0 < 0xa3 || boot0 >= 0x100){
		fprintf(stderr,"Card unsupported.\n");
		return -1;
	} else if (boot0 < 0xc0) {
		pte_from_pde = g80_pte_from_pde;
		physpages_from_pt = g80_physpages_from_pt;
	} else {
		pte_from_pde = gf100_pte_from_pde;
		physpages_from_pt = gf100_physpages_from_pt;
	}

	// First checking xfer-ext base to see if the fuc code was uploaded
	tmp_reg = peek(0x10a110);
	tmp_reg = tmp_reg & 0xffffff00;
	if ((tmp_reg & 0x0007ff00) != 0x0007ff00) {
		fprintf(stderr,"Register 0x10a110 not in order\n");
		return -1;
	}

	// Is channel set up?
	tmp_reg = peek(0x10a47c);
	if ((tmp_reg  & 0xf0000000) != 0x70000000) {
		fprintf(stderr,"Channel not set up\n");
		return -1;
	}

	// Find the pagetable based on this info
	chan_ptr = ((tmp_reg & 0x0fffffffull) << 12ull) &
			0x000000ffffffffffull; // XXX: Mask?
	ret = pte_from_pde(chan_ptr, &pte, &hostmem);

	if (ret)
		return ret;

	entries = physpages_from_pt(pte, hostmem, phys_pages);

	// And output the fuc codes
	for (i = 0; i < entries; i++) {
		hi = (phys_pages[i] & 0xffffff0000ull) >> 16ull;
		lo = phys_pages[i] & 0x0000ffff;
		poke(0x1700, hi | 0x2000000);

		// Read 4K from here and output this
		for (j = 0; j < 4096; j=j+4) {
			tmp_reg = peek(0x700000+lo+j);
			printf("%c%c%c%c",tmp_reg, tmp_reg>>8, tmp_reg>>16,
					tmp_reg>>24);
		}
	}

	return 0;
}